

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O0

void dumpNodeToDot(PSNode *node,PTType type)

{
  bool bVar1;
  PTType type_00;
  IDType IVar2;
  uint uVar3;
  PSNodeType PVar4;
  PointerSubgraph *pPVar5;
  size_t sVar6;
  PSNodeRet *this;
  reference ppPVar7;
  type tVar8;
  PSNode *in_RDI;
  Pointer *ptr;
  const_iterator __end1;
  const_iterator __begin1;
  PointsToSetT *__range1;
  PSNode *op;
  const_iterator __end2;
  const_iterator __begin2;
  NodesVec *__range2;
  PSNode *r_2;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *__range3_2;
  PSNodeRet *R;
  PSNode *r_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *__range3_1;
  PSNodeCallRet *CR;
  PSNode *r;
  const_iterator __end3;
  const_iterator __begin3;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *__range3;
  PSNodeEntry *entry;
  PSNodeAlloc *alloc;
  const_iterator *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  undefined1 dot;
  PSNode *n;
  Pointer in_stack_ffffffffffffff00;
  Offset local_f8 [11];
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_a0;
  NodesVec *local_98;
  PSNode *local_90;
  const_iterator in_stack_ffffffffffffff78;
  const_iterator in_stack_ffffffffffffff80;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_58;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *local_50;
  PSNodeCallRet *local_48;
  PSNode *local_40;
  PSNode **local_38;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_30;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *local_28;
  PSNodeEntry *local_20;
  PSNodeAlloc *local_18;
  PSNode *local_8;
  
  local_8 = in_RDI;
  type_00 = dg::SubgraphNode<dg::pta::PSNode>::getID((SubgraphNode<dg::pta::PSNode> *)(in_RDI + 8));
  IVar2 = dg::SubgraphNode<dg::pta::PSNode>::getID((SubgraphNode<dg::pta::PSNode> *)(local_8 + 8));
  printf("\tNODE%u [label=\"<%u> ",(ulong)type_00,(ulong)IVar2);
  dg::pta::PSNode::getType(local_8);
  printPSNodeType(0);
  printf("\\n");
  printName((PSNode *)in_stack_ffffffffffffff80._M_current,
            SUB81((ulong)in_stack_ffffffffffffff78._M_current >> 0x38,0));
  pPVar5 = dg::pta::PSNode::getParent(local_8);
  if (pPVar5 == (PointerSubgraph *)0x0) {
    uVar3 = 0;
  }
  else {
    pPVar5 = dg::pta::PSNode::getParent(local_8);
    uVar3 = dg::pta::PointerSubgraph::getID(pPVar5);
  }
  printf("\\nparent: %u\\n",(ulong)uVar3);
  local_18 = dg::pta::PSNodeAlloc::get<dg::pta::PSNode>
                       ((PSNode *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  if ((local_18 != (PSNodeAlloc *)0x0) &&
     (((sVar6 = dg::SubgraphNode<dg::pta::PSNode>::getSize
                          ((SubgraphNode<dg::pta::PSNode> *)(local_18 + 8)), sVar6 != 0 ||
       (bVar1 = dg::pta::PSNodeAlloc::isHeap(local_18), bVar1)) ||
      (bVar1 = dg::pta::PSNodeAlloc::isZeroInitialized(local_18), bVar1)))) {
    in_stack_fffffffffffffee8 =
         (const_iterator *)
         dg::SubgraphNode<dg::pta::PSNode>::getSize((SubgraphNode<dg::pta::PSNode> *)(local_18 + 8))
    ;
    bVar1 = dg::pta::PSNodeAlloc::isHeap(local_18);
    in_stack_fffffffffffffef4 = (uint)bVar1;
    bVar1 = dg::pta::PSNodeAlloc::isZeroInitialized(local_18);
    printf("\\n[size: %zu, heap: %u, zeroed: %u]",in_stack_fffffffffffffee8,
           (ulong)in_stack_fffffffffffffef4,(ulong)bVar1);
  }
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x164b11);
  if (bVar1) {
    local_20 = dg::pta::PSNodeEntry::get
                         ((PSNode *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    if (local_20 != (PSNodeEntry *)0x0) {
      printf("called from: [");
      local_28 = dg::pta::PSNodeEntry::getCallers(local_20);
      local_30._M_current =
           (PSNode **)
           std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                     ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                      in_stack_fffffffffffffee8);
      local_38 = (PSNode **)
                 std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                           ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                            in_stack_fffffffffffffee8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                 *)in_stack_fffffffffffffee8), bVar1) {
        ppPVar7 = __gnu_cxx::
                  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                  ::operator*(&local_30);
        local_40 = *ppPVar7;
        IVar2 = dg::SubgraphNode<dg::pta::PSNode>::getID
                          ((SubgraphNode<dg::pta::PSNode> *)(local_40 + 8));
        printf("%u ",(ulong)IVar2);
        __gnu_cxx::
        __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
        ::operator++(&local_30);
      }
      printf("]\\n");
    }
    local_48 = dg::pta::PSNodeCallRet::get
                         ((PSNode *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    if (local_48 != (PSNodeCallRet *)0x0) {
      printf("returns from: [");
      local_50 = dg::pta::PSNodeCallRet::getReturns(local_48);
      local_58._M_current =
           (PSNode **)
           std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                     ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                      in_stack_fffffffffffffee8);
      std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                 in_stack_fffffffffffffee8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                 *)in_stack_fffffffffffffee8), bVar1) {
        ppPVar7 = __gnu_cxx::
                  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                  ::operator*(&local_58);
        IVar2 = dg::SubgraphNode<dg::pta::PSNode>::getID
                          ((SubgraphNode<dg::pta::PSNode> *)(*ppPVar7 + 8));
        printf("%u ",(ulong)IVar2);
        __gnu_cxx::
        __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
        ::operator++(&local_58);
      }
      printf("]\\n");
    }
    this = dg::pta::PSNodeRet::get
                     ((PSNode *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    if (this != (PSNodeRet *)0x0) {
      printf("returns to: [");
      dg::pta::PSNodeRet::getReturnSites(this);
      in_stack_ffffffffffffff80 =
           std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                     ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                      in_stack_fffffffffffffee8);
      in_stack_ffffffffffffff78 =
           std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                     ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                      in_stack_fffffffffffffee8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                 *)in_stack_fffffffffffffee8), bVar1) {
        ppPVar7 = __gnu_cxx::
                  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                  ::operator*((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                               *)&stack0xffffffffffffff80);
        local_90 = *ppPVar7;
        IVar2 = dg::SubgraphNode<dg::pta::PSNode>::getID
                          ((SubgraphNode<dg::pta::PSNode> *)(local_90 + 8));
        printf("%u ",(ulong)IVar2);
        __gnu_cxx::
        __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
        ::operator++((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                      *)&stack0xffffffffffffff80);
      }
      printf("]\\n");
    }
  }
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x164dd5);
  if ((bVar1) &&
     (sVar6 = dg::SubgraphNode<dg::pta::PSNode>::getOperandsNum
                        ((SubgraphNode<dg::pta::PSNode> *)0x164def), sVar6 != 0)) {
    printf("\\n--- operands ---\\n");
    local_98 = dg::SubgraphNode<dg::pta::PSNode>::getOperands
                         ((SubgraphNode<dg::pta::PSNode> *)(local_8 + 8));
    local_a0._M_current =
         (PSNode **)
         std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                   ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
                    in_stack_fffffffffffffee8);
    std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
              ((vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *)
               in_stack_fffffffffffffee8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                               *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                              (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                               *)in_stack_fffffffffffffee8), bVar1) {
      __gnu_cxx::
      __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
      ::operator*(&local_a0);
      printName((PSNode *)in_stack_ffffffffffffff80._M_current,
                SUB81((ulong)in_stack_ffffffffffffff78._M_current >> 0x38,0));
      __gnu_cxx::
      __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
      ::operator++(&local_a0);
    }
    printf("\\n------\\n");
  }
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x164ea7);
  if ((bVar1) &&
     (bVar1 = dg::pta::PointerIdPointsToSet::empty((PointerIdPointsToSet *)0x164ec1), !bVar1)) {
    printf("\\n--- points-to set ---\\n");
  }
  dg::pta::PointerIdPointsToSet::begin
            ((PointerIdPointsToSet *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  dg::pta::PointerIdPointsToSet::end
            ((PointerIdPointsToSet *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  while( true ) {
    n = in_stack_ffffffffffffff00.target;
    bVar1 = dg::pta::PointerIdPointsToSet::const_iterator::operator!=
                      ((const_iterator *)
                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       in_stack_fffffffffffffee8);
    dot = (undefined1)(uVar3 >> 0x18);
    if (!bVar1) break;
    in_stack_ffffffffffffff00 =
         dg::pta::PointerIdPointsToSet::const_iterator::operator*(in_stack_fffffffffffffee8);
    printf("\\n    -> ");
    printName((PSNode *)in_stack_ffffffffffffff80._M_current,
              SUB81((ulong)in_stack_ffffffffffffff78._M_current >> 0x38,0));
    printf(" + ");
    bVar1 = dg::Offset::isUnknown(local_f8);
    if (bVar1) {
      printf("Offset::UNKNOWN");
    }
    else {
      tVar8 = dg::Offset::operator*(local_f8);
      printf("%lu",tVar8);
    }
    dg::pta::PointerIdPointsToSet::const_iterator::operator++
              ((const_iterator *)in_stack_ffffffffffffff00.target);
  }
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x164fcf);
  if (bVar1) {
    dumpPointerGraphData(n,type_00,(bool)dot);
  }
  printf("\", shape=box");
  PVar4 = dg::pta::PSNode::getType(local_8);
  if (PVar4 == STORE) {
    printf(", style=filled, fillcolor=orange");
  }
  else {
    bVar1 = dg::pta::PointerIdPointsToSet::empty((PointerIdPointsToSet *)0x165022);
    if ((bVar1) &&
       ((((PVar4 = dg::pta::PSNode::getType(local_8), PVar4 == LOAD ||
          (PVar4 = dg::pta::PSNode::getType(local_8), PVar4 == GEP)) ||
         (PVar4 = dg::pta::PSNode::getType(local_8), PVar4 == CAST)) ||
        (PVar4 = dg::pta::PSNode::getType(local_8), PVar4 == PHI)))) {
      printf(", style=filled, fillcolor=red");
    }
  }
  printf("]\n");
  return;
}

Assistant:

static void dumpNodeToDot(PSNode *node, PTType type) {
    printf("\tNODE%u [label=\"<%u> ", node->getID(), node->getID());
    printPSNodeType(node->getType());
    printf("\\n");
    printName(node, true);
    printf("\\nparent: %u\\n",
           node->getParent() ? node->getParent()->getID() : 0);

    PSNodeAlloc *alloc = PSNodeAlloc::get(node);
    if (alloc &&
        (alloc->getSize() || alloc->isHeap() || alloc->isZeroInitialized()))
        printf("\\n[size: %zu, heap: %u, zeroed: %u]", alloc->getSize(),
               alloc->isHeap(), alloc->isZeroInitialized());
    if (verbose) {
        if (PSNodeEntry *entry = PSNodeEntry::get(node)) {
            printf("called from: [");
            for (auto *r : entry->getCallers())
                printf("%u ", r->getID());
            printf("]\\n");
        }
        if (PSNodeCallRet *CR = PSNodeCallRet::get(node)) {
            printf("returns from: [");
            for (auto *r : CR->getReturns())
                printf("%u ", r->getID());
            printf("]\\n");
        }
        if (PSNodeRet *R = PSNodeRet::get(node)) {
            printf("returns to: [");
            for (auto *r : R->getReturnSites())
                printf("%u ", r->getID());
            printf("]\\n");
        }
    }

    if (verbose && node->getOperandsNum() > 0) {
        printf("\\n--- operands ---\\n");
        for (PSNode *op : node->getOperands()) {
            printName(op, true);
        }
        printf("\\n------\\n");
    }

    if (verbose && !node->pointsTo.empty()) {
        printf("\\n--- points-to set ---\\n");
    }

    for (const Pointer &ptr : node->pointsTo) {
        printf("\\n    -> ");
        printName(ptr.target, true);
        printf(" + ");
        if (ptr.offset.isUnknown())
            printf("Offset::UNKNOWN");
        else
            printf("%" PRIu64, *ptr.offset);
    }

    if (verbose) {
        dumpPointerGraphData(node, type, true /* dot */);
    }

    printf("\", shape=box");
    if (node->getType() != PSNodeType::STORE) {
        if (node->pointsTo.empty() && (node->getType() == PSNodeType::LOAD ||
                                       node->getType() == PSNodeType::GEP ||
                                       node->getType() == PSNodeType::CAST ||
                                       node->getType() == PSNodeType::PHI))
            printf(", style=filled, fillcolor=red");
    } else {
        printf(", style=filled, fillcolor=orange");
    }

    printf("]\n");
}